

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

bsp_pid_t bsp_nprocs(void)

{
  int local_18;
  int local_14;
  int nprocs;
  int fini;
  int init;
  
  if (s_spmd == (Spmd *)0x0) {
    MPI_Initialized(&nprocs);
    MPI_Finalized(&local_14);
    if (local_14 != 0) {
      bsp_abort("bsp_nprocs: internal error\n");
    }
    if (nprocs == 0) {
      MPI_Init(0);
      atexit(bsp_check_exit);
    }
    local_18 = -1;
    MPI_Comm_size(&ompi_mpi_comm_world,&local_18);
    fini = local_18;
  }
  else {
    fini = bsplib::Spmd::nprocs(s_spmd);
  }
  return fini;
}

Assistant:

bsp_pid_t bsp_nprocs()
{
    if (!s_spmd) {
        int init, fini;
        MPI_Initialized( & init );
        MPI_Finalized( &fini );
        if ( fini )
            bsp_abort("bsp_nprocs: internal error\n");
        
        if (!init ) {
            MPI_Init(NULL, NULL);
            atexit( bsp_check_exit );
        }

        int nprocs = -1;
        MPI_Comm_size( MPI_COMM_WORLD, &nprocs);

        return nprocs;
    }
    else {
        return s_spmd->nprocs();
    }
}